

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

int Au_NtkAllocObj(Au_Ntk_t *p,int nFanins,int Type)

{
  uint uVar1;
  void *pvVar2;
  void *Entry;
  uint uVar3;
  uint uVar4;
  int f;
  uint uVar5;
  int i;
  Vec_Int_t *p_00;
  Au_Obj_t *p_01;
  
  uVar4 = (((int)(nFanins + 2U) >> 2) + 1) - (uint)((nFanins + 2U & 3) == 0);
  uVar1 = ((uint)((uVar4 - 0x3f & 0x3f) != 0) * 0x40 + uVar4) - 0x3f | 0x3f;
  if ((int)uVar4 < 0x40) {
    uVar1 = uVar4;
  }
  do {
    if (((p->vPages).nSize == 0) || (0x1000 < (int)(p->iHandle + uVar1))) {
      if ((int)uVar1 < 0xfc1) {
        Entry = calloc(0x1040,0x10);
        uVar5 = 0x1040;
      }
      else {
        uVar5 = uVar1 + 0x40;
        Entry = calloc((ulong)uVar5,0x10);
      }
      p->nObjsAlloc = p->nObjsAlloc + uVar5;
      Vec_PtrPush(p->vChunks,Entry);
      pvVar2 = (void *)(((ulong)Entry & 0xfffffffffffffff0) + 0x10);
      if (((ulong)Entry & 0xf) == 0) {
        pvVar2 = Entry;
      }
      if (((ulong)pvVar2 & 0xf) != 0) {
        __assert_fail("((ABC_PTRINT_T)pMem & 0xF) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                      ,0x309,"int Au_NtkAllocObj(Au_Ntk_t *, int, int)");
      }
      uVar3 = (uint)((ulong)pvVar2 >> 4) & 0x3f;
      uVar5 = 0x40 - uVar3;
      if (((ulong)pvVar2 >> 4 & 0x3f) == 0) {
        uVar5 = uVar3;
      }
      pvVar2 = (void *)((ulong)(uVar5 << 4) + (long)pvVar2);
      p->iHandle = 0;
      Vec_PtrPush(&p->vPages,pvVar2);
      Au_NtkInsertHeader(p);
      uVar5 = p->iHandle;
      break;
    }
    pvVar2 = Vec_PtrEntryLast(&p->vPages);
    uVar5 = p->iHandle;
    uVar3 = uVar5 & 0x3f;
    if ((uVar3 == 0) || ((int)(0x40 - uVar3) < (int)uVar1)) {
      if (uVar3 != 0) {
        p->iHandle = (uVar5 & 0xffffffc0) + 0x40;
      }
      Au_NtkInsertHeader(p);
      uVar5 = p->iHandle;
    }
  } while (0x1000 < (int)(uVar5 + uVar1));
  if (*(int *)((long)pvVar2 + (long)(int)uVar5 * 0x10) != 0) {
    __assert_fail("*((int *)pObj) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                  ,800,"int Au_NtkAllocObj(Au_Ntk_t *, int, int)");
  }
  p_01 = (Au_Obj_t *)((long)pvVar2 + (long)(int)uVar5 * 0x10);
  *(ulong *)p_01 = (ulong)(Type & 7) << 0x20 | (ulong)(uint)nFanins << 0x23 | (ulong)*(uint *)p_01;
  p->nObjs[Type & 7] = p->nObjs[Type & 7] + 1;
  if (Type == 2) {
    p_00 = &p->vPis;
    f = (p->vPis).nSize;
    i = 0;
  }
  else {
    if (Type != 3) {
      uVar5 = (uint)((ulong)p_01 >> 4) & 0x3f;
      goto LAB_006ac79d;
    }
    p_00 = &p->vPos;
    f = (p->vPos).nSize;
    i = 1;
  }
  Au_ObjSetFaninLit(p_01,i,f);
  uVar5 = (uint)((ulong)p_01 >> 4) & 0x3f;
  Vec_IntPush(p_00,*(uint *)(((ulong)p_01 & 0xfffffffffffffc00) + 8) | uVar5);
LAB_006ac79d:
  p->iHandle = p->iHandle + uVar1;
  p->nObjsUsed = p->nObjsUsed + uVar4;
  uVar1 = *(uint *)((long)p_01 + (8 - (ulong)((uint)p_01 & 0x3ff)));
  Vec_IntPush(&p->vObjs,uVar5 | uVar1);
  if ((Au_Obj_t *)
      ((ulong)((uVar5 | uVar1 & 0xfff) << 4) + (long)(p->vPages).pArray[(int)uVar1 >> 0xc]) != p_01)
  {
    __assert_fail("pTemp == pObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                  ,0x333,"int Au_NtkAllocObj(Au_Ntk_t *, int, int)");
  }
  return uVar5 | uVar1;
}

Assistant:

int Au_NtkAllocObj( Au_Ntk_t * p, int nFanins, int Type )
{
    Au_Obj_t * pMem, * pObj, * pTemp;
    int nObjInt = ((2+nFanins) >> 2) + (((2+nFanins) & 3) > 0);
    int Id, nObjIntReal = nObjInt;
    if ( nObjInt > 63 )
        nObjInt = 63 + 64 * (((nObjInt-63) >> 6) + (((nObjInt-63) & 63) > 0));
    if ( Vec_PtrSize(&p->vPages) == 0 || p->iHandle + nObjInt > (1 << 12) )
    {
        if ( nObjInt + 64 > (1 << 12) )
            pMem = ABC_CALLOC( Au_Obj_t, nObjInt + 64 ), p->nObjsAlloc += nObjInt + 64;
        else
            pMem = ABC_CALLOC( Au_Obj_t, (1 << 12) + 64 ), p->nObjsAlloc += (1 << 12) + 64;
        Vec_PtrPush( p->vChunks, pMem );
        if ( ((ABC_PTRINT_T)pMem & 0xF) )
            pMem = (Au_Obj_t *)((char *)pMem + 16 - ((ABC_PTRINT_T)pMem & 0xF));
        assert( ((ABC_PTRINT_T)pMem & 0xF) == 0 );
        p->iHandle = (((ABC_PTRINT_T)pMem & 0x3FF) >> 4);
        if ( p->iHandle )
        {
            pMem += 64 - (p->iHandle & 63);
            p->iHandle = 0; 
        }
        Vec_PtrPush( &p->vPages, pMem );
        Au_NtkInsertHeader( p );
    }
    else
    {
        pMem = (Au_Obj_t *)Vec_PtrEntryLast( &p->vPages );
        if ( (p->iHandle & 63) == 0 || nObjInt > (64 - (p->iHandle & 63)) )
        {
            if ( p->iHandle & 63 )
                p->iHandle += 64 - (p->iHandle & 63); 
            Au_NtkInsertHeader( p );
        }
        if ( p->iHandle + nObjInt > (1 << 12) )
            return Au_NtkAllocObj( p, nFanins, Type );
    }
    pObj = pMem + p->iHandle;
    assert( *((int *)pObj) == 0 );
    pObj->nFanins = nFanins;
    p->nObjs[pObj->Type = Type]++;
    if ( Type == AU_OBJ_PI )
    {
        Au_ObjSetFaninLit( pObj, 0, Vec_IntSize(&p->vPis) );
        Vec_IntPush( &p->vPis, Au_ObjId(pObj) );
    }
    else if ( Type == AU_OBJ_PO )
    {
        Au_ObjSetFaninLit( pObj, 1, Vec_IntSize(&p->vPos) );
        Vec_IntPush( &p->vPos, Au_ObjId(pObj) );
    }
    p->iHandle += nObjInt;
    p->nObjsUsed += nObjIntReal;

    Id = Au_ObjId(pObj);
    Vec_IntPush( &p->vObjs, Id );
    pTemp = Au_NtkObj( p, Id );
    assert( pTemp == pObj );
    return Id;
}